

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O1

put_transaction<void> * __thiscall
density::
lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
::start_dyn_push_copy
          (put_transaction<void> *__return_storage_ptr__,
          lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          *this,runtime_type *i_type,void *i_source)

{
  void *pvVar1;
  Allocation push_data;
  Allocation local_60;
  put_transaction<void> local_48;
  
  detail::
  LFQueue_Tail<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  ::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)0>
            (&local_60,
             (LFQueue_Tail<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
              *)this,1,true,
             (i_type->m_feature_table->
             super__Tuple_impl<0UL,_density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
             ).
             super__Tuple_impl<1UL,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
             .
             super__Tuple_impl<2UL,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
             .super__Tuple_impl<3UL,_density::f_destroy,_density::f_size,_density::f_alignment>.
             super__Tuple_impl<4UL,_density::f_size,_density::f_alignment>.
             super__Head_base<4UL,_density::f_size,_false>._M_head_impl.m_size,
             (size_t)(i_type->m_feature_table->
                     super__Tuple_impl<0UL,_density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
                     ).
                     super__Tuple_impl<1UL,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
                     .
                     super__Tuple_impl<2UL,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
                     .
                     super__Tuple_impl<3UL,_density::f_destroy,_density::f_size,_density::f_alignment>
                     .super__Tuple_impl<4UL,_density::f_size,_density::f_alignment>.
                     super__Tuple_impl<5UL,_density::f_alignment>.
                     super__Head_base<5UL,_density::f_alignment,_false>);
  pvVar1 = local_60.m_user_storage;
  local_60.m_control_block[1].m_next = (uintptr_t)i_type->m_feature_table;
  if (i_type->m_feature_table == (tuple_type *)0x0) {
    density_tests::detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/runtime_type.h"
               ,0x373);
  }
  (*(i_type->m_feature_table->
    super__Tuple_impl<0UL,_density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
    ).
    super__Tuple_impl<1UL,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
    .
    super__Tuple_impl<2UL,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
    .super__Head_base<2UL,_density::f_copy_construct,_false>._M_head_impl.m_function)
            (pvVar1,i_source);
  local_48.m_put.m_control_block = local_60.m_control_block;
  local_48.m_put.m_next_ptr = local_60.m_next_ptr;
  (__return_storage_ptr__->m_put).m_user_storage = local_60.m_user_storage;
  (__return_storage_ptr__->m_put).m_control_block = local_60.m_control_block;
  (__return_storage_ptr__->m_put).m_next_ptr = local_60.m_next_ptr;
  __return_storage_ptr__->m_queue = this;
  local_48.m_put.m_user_storage = (void *)0x0;
  local_48.m_queue = this;
  put_transaction<void>::~put_transaction(&local_48);
  return __return_storage_ptr__;
}

Assistant:

put_transaction<> start_dyn_push_copy(const runtime_type & i_type, const void * i_source)
        {
            auto push_data = Base::template try_inplace_allocate_impl<detail::LfQueue_Throwing>(
              detail::LfQueue_Busy, true, i_type.size(), i_type.alignment());

            runtime_type * type = nullptr;
            try
            {
                auto const type_storage = Base::type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) runtime_type(i_type);

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                i_type.copy_construct(push_data.m_user_storage, i_source);
            }
            catch (...)
            {
                if (type != nullptr)
                    type->RUNTIME_TYPE::~RUNTIME_TYPE();
                Base::cancel_put_nodestroy_impl(push_data);
                throw;
            }

            return put_transaction<void>(PrivateType(), this, push_data);
        }